

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::overstrike(Fl_Text_Display *this,char *text)

{
  int pos;
  Fl_Text_Buffer *this_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  Fl_Text_Buffer *this_01;
  int iVar5;
  char *local_88;
  char *local_60;
  char *paddedText;
  char *pcStack_50;
  uint ch;
  char *c;
  int endIndent;
  int startIndent;
  int indent;
  int endPos;
  int p;
  int i;
  int textLen;
  int lineStart;
  Fl_Text_Buffer *buf;
  int startPos;
  char *text_local;
  Fl_Text_Display *this_local;
  
  pos = this->mCursorPos;
  this_00 = this->mBuffer;
  iVar1 = Fl_Text_Buffer::line_start(this_00,pos);
  sVar4 = strlen(text);
  iVar5 = (int)sVar4;
  local_60 = (char *)0x0;
  iVar1 = Fl_Text_Buffer::count_displayed_characters(this->mBuffer,iVar1,pos);
  endIndent = iVar1;
  for (pcStack_50 = text; iVar2 = endIndent, indent = pos, *pcStack_50 != '\0';
      pcStack_50 = pcStack_50 + iVar2) {
    endIndent = endIndent + 1;
    iVar2 = fl_utf8len1(*pcStack_50);
  }
  while( true ) {
    endIndent = iVar1;
    iVar1 = Fl_Text_Buffer::length(this_00);
    if ((indent == iVar1) || (uVar3 = Fl_Text_Buffer::char_at(this_00,indent), uVar3 == 10))
    goto LAB_002211e3;
    iVar1 = endIndent + 1;
    if (iVar1 == iVar2) break;
    if (iVar2 < iVar1) {
      if (uVar3 != 9) {
        indent = indent + 1;
        local_60 = (char *)operator_new__((long)(iVar5 + 0x15));
        strcpy(local_60,text);
        for (endPos = 0; endPos < iVar1 - iVar2; endPos = endPos + 1) {
          local_60[iVar5 + endPos] = ' ';
        }
        local_60[iVar5 + endPos] = '\0';
      }
      goto LAB_002211e3;
    }
    this_01 = buffer(this);
    indent = Fl_Text_Buffer::next_char(this_01,indent);
  }
  indent = indent + 1;
LAB_002211e3:
  this->mCursorToHint = pos + iVar5;
  local_88 = text;
  if (local_60 != (char *)0x0) {
    local_88 = local_60;
  }
  Fl_Text_Buffer::replace(this_00,pos,indent,local_88);
  this->mCursorToHint = -1;
  if ((local_60 != (char *)0x0) && (local_60 != (char *)0x0)) {
    operator_delete__(local_60);
  }
  return;
}

Assistant:

void Fl_Text_Display::overstrike(const char* text) {
  IS_UTF8_ALIGNED2(buffer(), mCursorPos)
  IS_UTF8_ALIGNED(text)

  int startPos = mCursorPos;
  Fl_Text_Buffer *buf = mBuffer;
  int lineStart = buf->line_start( startPos );
  int textLen = (int) strlen( text );
  int i, p, endPos, indent, startIndent, endIndent;
  const char *c;
  unsigned int ch;
  char *paddedText = NULL;

  /* determine how many displayed character positions are covered */
  startIndent = mBuffer->count_displayed_characters( lineStart, startPos );
  indent = startIndent;
  for ( c = text; *c != '\0'; c += fl_utf8len1(*c) )
    indent++;
  endIndent = indent;

  /* find which characters to remove, and if necessary generate additional
   padding to make up for removed control characters at the end */
  indent = startIndent;
  for ( p = startPos; ; p=buffer()->next_char(p) ) {
    if ( p == buf->length() )
      break;
    ch = buf->char_at( p );
    if ( ch == '\n' )
      break;
    indent++;
    if ( indent == endIndent ) {
      p++;
      break;
    } else if ( indent > endIndent ) {
      if ( ch != '\t' ) {
        p++;
        paddedText = new char [ textLen + FL_TEXT_MAX_EXP_CHAR_LEN + 1 ];
        strcpy( paddedText, text );
        for ( i = 0; i < indent - endIndent; i++ )
          paddedText[ textLen + i ] = ' ';
        paddedText[ textLen + i ] = '\0';
      }
      break;
    }
  }
  endPos = p;

  mCursorToHint = startPos + textLen;
  buf->replace( startPos, endPos, paddedText == NULL ? text : paddedText );
  mCursorToHint = NO_HINT;
  if ( paddedText != NULL )
    delete [] paddedText;
}